

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O1

void __thiscall
ParserTest_InvalidFunctionCallsThrow_Test::~ParserTest_InvalidFunctionCallsThrow_Test
          (ParserTest_InvalidFunctionCallsThrow_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, InvalidFunctionCallsThrow)
{
  const auto func = std::bind(&Parser::parseFunctionCall, std::placeholders::_1, std::optional<Token>{});
  testThrow("f(", func);
  testThrow("f)", func);
  testThrow("f(x,)", func);
  testThrow("f(x y)", func);
  testThrow("(x y)", func);
}